

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsCoreMakeConnections(HelicsCore core,char *file,HelicsError *err)

{
  element_type *peVar1;
  CoreObject *pCVar2;
  size_t sVar3;
  long *local_40 [2];
  long local_30 [2];
  
  pCVar2 = helics::getCoreObject(core,err);
  if ((pCVar2 != (CoreObject *)0x0) &&
     (peVar1 = (pCVar2->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , peVar1 != (element_type *)0x0)) {
    local_40[0] = local_30;
    if (file == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar3 = strlen(file);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,file,file + sVar3);
    }
    (*peVar1->_vptr_Core[0x46])(peVar1,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void helicsCoreMakeConnections(HelicsCore core, const char* file, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->makeConnections(AS_STRING(file));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}